

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O1

size_t __thiscall
proto2_nofieldpresence_unittest::TestAllMapTypes::ByteSizeLong(TestAllMapTypes *this)

{
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignEnumEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignEnum,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
  *this_00;
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_01;
  MapField<proto2_nofieldpresence_unittest::TestAllMapTypes_MapInt32ExplicitForeignMessageEntry_DoNotUse,_int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_02;
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long *plVar12;
  long lVar13;
  
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  uVar10 = (ulong)*(uint *)((long)&this->field_0 + 0x10);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  uVar7 = *(uint *)((long)&this->field_0 + 0x18);
  uVar8 = (ulong)uVar7;
  if (uVar7 == *(uint *)((long)&this->field_0 + 0x14)) {
    uVar8 = 0;
    plVar12 = (long *)0x0;
  }
  else {
    plVar12 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_bytes_.
                                          super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          .field_0 + 0x10) + uVar8 * 8);
    if (plVar12 == (long *)0x0) goto LAB_00d11fbe;
  }
  while (plVar12 != (long *)0x0) {
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
            ::ByteSizeLong((int *)(plVar12 + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar12 + 2));
    plVar12 = (long *)*plVar12;
    if (plVar12 == (long *)0x0) {
      do {
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
        if (*(uint *)((long)&this->field_0 + 0x14) <= uVar7) {
          plVar12 = (long *)0x0;
          uVar8 = 0;
          break;
        }
        plVar12 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_bytes_.
                                              super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              .field_0 + 0x10) + (ulong)uVar7 * 8);
      } while (plVar12 == (long *)0x0);
    }
    uVar10 = uVar10 + sVar5;
  }
  this_00 = &(this->field_0)._impl_.map_int32_foreign_enum_;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
  uVar7 = *(uint *)((long)&this->field_0 + 0x40);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_00);
  uVar1 = *(uint *)((long)&this->field_0 + 0x44);
  uVar2 = *(uint *)((long)&this->field_0 + 0x48);
  uVar8 = (ulong)uVar2;
  if (uVar2 == uVar1) {
    uVar8 = 0;
    puVar9 = (undefined8 *)0x0;
  }
  else {
    puVar9 = *(undefined8 **)
              (*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_enum_.
                                super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                                .field_0 + 0x10) + uVar8 * 8);
    if (puVar9 == (undefined8 *)0x0) goto LAB_00d11fbe;
  }
  lVar13 = uVar10 + uVar7;
  if (puVar9 != (undefined8 *)0x0) {
    do {
      puVar11 = (undefined8 *)*puVar9;
      while (puVar11 == (undefined8 *)0x0) {
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
        if (uVar1 <= uVar7) {
          puVar11 = (undefined8 *)0x0;
          uVar8 = 0;
          break;
        }
        puVar11 = *(undefined8 **)
                   (*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_enum_.
                                     super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>
                                     .field_0 + 0x10) + (ulong)uVar7 * 8);
      }
      lVar3 = 0x3f;
      if (((long)*(int *)(puVar9 + 1) | 1U) != 0) {
        for (; ((long)*(int *)(puVar9 + 1) | 1U) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar10 = (long)*(int *)((long)puVar9 + 0xc) | 1;
      lVar4 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      lVar13 = lVar13 + (ulong)(((int)lVar4 * 9 + 0x49U >> 6) + ((int)lVar3 * 9 + 0x49U >> 6)) + 3;
      puVar9 = puVar11;
    } while (puVar11 != (undefined8 *)0x0);
  }
  this_01 = &(this->field_0)._impl_.map_int32_foreign_message_;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
  uVar7 = *(uint *)((long)&this->field_0 + 0x70);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_01);
  uVar1 = *(uint *)((long)&this->field_0 + 0x78);
  uVar10 = (ulong)uVar1;
  if (uVar1 == *(uint *)((long)&this->field_0 + 0x74)) {
    uVar10 = 0;
    plVar12 = (long *)0x0;
  }
  else {
    plVar12 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_message_.
                                          super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                                          .field_0 + 0x10) + uVar10 * 8);
    if (plVar12 == (long *)0x0) goto LAB_00d11fbe;
  }
  lVar13 = lVar13 + (ulong)uVar7;
  while (plVar12 != (long *)0x0) {
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((int *)(plVar12 + 1),(ForeignMessage *)(plVar12 + 2));
    plVar12 = (long *)*plVar12;
    if (plVar12 == (long *)0x0) {
      do {
        uVar7 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar7;
        if (*(uint *)((long)&this->field_0 + 0x74) <= uVar7) {
          uVar10 = 0;
          plVar12 = (long *)0x0;
          break;
        }
        plVar12 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_foreign_message_.
                                              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                                              .field_0 + 0x10) + (ulong)uVar7 * 8);
      } while (plVar12 == (long *)0x0);
    }
    lVar13 = lVar13 + sVar5;
  }
  this_02 = &(this->field_0)._impl_.map_int32_explicit_foreign_message_;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_02);
  uVar7 = *(uint *)((long)&this->field_0 + 0xa0);
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField((MapFieldBase *)this_02);
  uVar1 = *(uint *)((long)&this->field_0 + 0xa8);
  uVar10 = (ulong)uVar1;
  if (uVar1 == *(uint *)((long)&this->field_0 + 0xa4)) {
    uVar10 = 0;
    plVar12 = (long *)0x0;
  }
  else {
    plVar12 = *(long **)(*(long *)((long)&(this->field_0)._impl_.map_int32_explicit_foreign_message_
                                          .
                                          super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                                          .field_0 + 0x10) + uVar10 * 8);
    if (plVar12 == (long *)0x0) {
LAB_00d11fbe:
      google::protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  sVar5 = lVar13 + (ulong)uVar7;
  do {
    if (plVar12 == (long *)0x0) {
      sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                        (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
      return sVar5;
    }
    sVar6 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((int *)(plVar12 + 1),(ExplicitForeignMessage *)(plVar12 + 2));
    plVar12 = (long *)*plVar12;
    if (plVar12 == (long *)0x0) {
      do {
        uVar7 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar7;
        if (*(uint *)((long)&this->field_0 + 0xa4) <= uVar7) {
          uVar10 = 0;
          plVar12 = (long *)0x0;
          break;
        }
        plVar12 = *(long **)(*(long *)((long)&(this->field_0)._impl_.
                                              map_int32_explicit_foreign_message_.
                                              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
                                              .field_0 + 0x10) + (ulong)uVar7 * 8);
      } while (plVar12 == (long *)0x0);
    }
    sVar5 = sVar5 + sVar6;
  } while( true );
}

Assistant:

::size_t TestAllMapTypes::ByteSizeLong() const {
  const TestAllMapTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, bytes> map_int32_bytes = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_bytes_size());
      for (const auto& entry : this_._internal_map_int32_bytes()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, std::string,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_BYTES>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignEnum> map_int32_foreign_enum = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_enum_size());
      for (const auto& entry : this_._internal_map_int32_foreign_enum()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignEnum,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_ENUM>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignMessage> map_int32_foreign_message = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ExplicitForeignMessage> map_int32_explicit_foreign_message = 4;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_explicit_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_explicit_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ExplicitForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}